

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

ArrayFill * __thiscall
wasm::Builder::makeArrayFill
          (Builder *this,Expression *ref,Expression *index,Expression *value,Expression *size)

{
  ArrayFill *pAVar1;
  ArrayFill *ret;
  Expression *size_local;
  Expression *value_local;
  Expression *index_local;
  Expression *ref_local;
  Builder *this_local;
  
  pAVar1 = MixedArena::alloc<wasm::ArrayFill>(&this->wasm->allocator);
  pAVar1->ref = ref;
  pAVar1->index = index;
  pAVar1->value = value;
  pAVar1->size = size;
  ::wasm::ArrayFill::finalize();
  return pAVar1;
}

Assistant:

ArrayFill* makeArrayFill(Expression* ref,
                           Expression* index,
                           Expression* value,
                           Expression* size) {
    auto* ret = wasm.allocator.alloc<ArrayFill>();
    ret->ref = ref;
    ret->index = index;
    ret->value = value;
    ret->size = size;
    ret->finalize();
    return ret;
  }